

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  int new_capacity;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ImGuiStoragePair *pIVar7;
  
  pIVar7 = this->Data;
  if ((it < pIVar7) || (uVar4 = (ulong)this->Size, pIVar7 + uVar4 < it)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x61f,"insert","ImGui ASSERT FAILED: %s","it >= Data && it <= Data + Size");
    pIVar7 = this->Data;
    uVar4 = (ulong)(uint)this->Size;
  }
  lVar6 = (long)it - (long)pIVar7;
  iVar3 = (int)uVar4;
  if (iVar3 == this->Capacity) {
    if (iVar3 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 2) + iVar3;
    }
    new_capacity = iVar3 + 1;
    if (iVar3 + 1 < iVar2) {
      new_capacity = iVar2;
    }
    reserve(this,new_capacity);
    iVar3 = this->Size;
    pIVar7 = this->Data;
  }
  lVar5 = (long)iVar3 - (lVar6 >> 4);
  if (lVar5 != 0 && lVar6 >> 4 <= (long)iVar3) {
    memmove((void *)((long)pIVar7 + lVar6 + 0x10),(void *)((long)pIVar7 + lVar6),lVar5 * 0x10);
    pIVar7 = this->Data;
  }
  aVar1 = v->field_1;
  *(undefined8 *)((long)pIVar7 + lVar6) = *(undefined8 *)v;
  *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)((undefined8 *)((long)pIVar7 + lVar6) + 1) =
       aVar1;
  this->Size = this->Size + 1;
  return (ImGuiStoragePair *)(lVar6 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }